

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::Discreet3DSImporter(Discreet3DSImporter *this)

{
  Discreet3DSImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00faf628;
  this->stream = (StreamReaderLE *)0x0;
  this->mLastNodeIndex = 0;
  this->mCurrentNode = (Node *)0x0;
  this->mRootNode = (Node *)0x0;
  this->mScene = (Scene *)0x0;
  aiColor3D::aiColor3D(&this->mClrAmbient);
  this->mMasterScale = 0.0;
  std::__cxx11::string::string((string *)&this->mBackgroundImage);
  this->bHasBG = false;
  this->bIsPrj = false;
  return;
}

Assistant:

Discreet3DSImporter::Discreet3DSImporter()
: stream()
, mLastNodeIndex()
, mCurrentNode()
, mRootNode()
, mScene()
, mMasterScale()
, bHasBG()
, bIsPrj() {
    // empty
}